

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int patternCompare(u8 *zPattern,u8 *zString,compareInfo *pInfo,u32 esc)

{
  byte bVar1;
  u8 uVar2;
  bool bVar3;
  byte *pbVar4;
  bool bVar5;
  u32 uVar6;
  u32 uVar7;
  u32 uVar8;
  int iVar9;
  byte *zString_00;
  bool bVar10;
  uint uVar11;
  u8 *puVar12;
  bool bVar13;
  u8 *zPattern_local;
  byte *local_50;
  u32 local_44;
  uint local_40;
  u32 local_3c;
  compareInfo *local_38;
  
  bVar1 = pInfo->matchAll;
  local_40 = (uint)pInfo->matchSet;
  uVar2 = pInfo->noCase;
  local_3c = (u32)pInfo->matchOne;
  uVar11 = (uint)pInfo->matchOne;
  zPattern_local = zPattern;
  local_50 = zString;
  local_44 = esc;
  local_38 = pInfo;
  bVar3 = false;
LAB_0013b841:
  while( true ) {
    while( true ) {
      uVar6 = sqlite3Utf8Read(&zPattern_local);
      if (uVar6 == 0) {
        return (uint)(*local_50 == 0);
      }
      if (uVar6 == bVar1 && !bVar3) {
        do {
          uVar7 = sqlite3Utf8Read(&zPattern_local);
          uVar6 = local_44;
          if (uVar7 != uVar11 && uVar7 != bVar1) {
            if (uVar7 == 0) {
              return 1;
            }
            if (uVar7 == local_44) {
              uVar7 = sqlite3Utf8Read(&zPattern_local);
              if (uVar7 == 0) {
                return 0;
              }
            }
            else if (uVar7 == local_40) {
              puVar12 = zPattern_local + -1;
              pbVar4 = local_50;
              while( true ) {
                zString_00 = pbVar4;
                bVar1 = *zString_00;
                uVar11 = (uint)(bVar1 != 0);
                if (bVar1 == 0) {
                  return uVar11;
                }
                iVar9 = patternCompare(puVar12,zString_00,local_38,uVar6);
                if (iVar9 != 0) break;
                pbVar4 = zString_00 + 1;
                if (0xbf < bVar1) {
                  pbVar4 = zString_00 + 1;
                }
              }
              return uVar11;
            }
            puVar12 = zPattern_local;
            while( true ) {
              uVar8 = sqlite3Utf8Read(&local_50);
              if (uVar8 == 0) {
                return 0;
              }
              if (uVar2 == '\0') {
                while ((uVar8 != 0 && (uVar8 != uVar7))) {
                  uVar8 = sqlite3Utf8Read(&local_50);
                }
              }
              else {
                if (uVar8 < 0x80) {
                  uVar8 = (u32)""[uVar8];
                }
                if (uVar7 < 0x80) {
                  uVar7 = (u32)""[uVar7];
                }
                while ((uVar8 != 0 && (uVar8 != uVar7))) {
                  uVar8 = sqlite3Utf8Read(&local_50);
                  if (uVar8 < 0x80) {
                    uVar8 = (u32)""[uVar8];
                  }
                }
              }
              if (uVar8 == 0) break;
              iVar9 = patternCompare(puVar12,local_50,local_38,uVar6);
              if (iVar9 != 0) {
                return 1;
              }
            }
            return 0;
          }
        } while ((uVar7 != uVar11) || (uVar6 = sqlite3Utf8Read(&local_50), uVar6 != 0));
        return 0;
      }
      if (uVar6 != uVar11 || bVar3) break;
      uVar6 = sqlite3Utf8Read(&local_50);
      bVar3 = false;
      if (uVar6 == 0) {
        return 0;
      }
    }
    if (uVar6 == local_40) break;
    bVar13 = uVar6 != local_44 || bVar3;
    bVar3 = true;
    if (bVar13) {
      uVar7 = sqlite3Utf8Read(&local_50);
      if (uVar2 != '\0') {
        if (uVar6 < 0x80) {
          uVar6 = (u32)""[uVar6];
        }
        if (uVar7 < 0x80) {
          uVar7 = (u32)""[uVar7];
        }
      }
      bVar3 = false;
      if (uVar6 != uVar7) {
        return 0;
      }
    }
  }
  uVar6 = sqlite3Utf8Read(&local_50);
  if (uVar6 == 0) {
    return 0;
  }
  uVar7 = sqlite3Utf8Read(&zPattern_local);
  bVar13 = uVar7 == 0x5e;
  if (bVar13) {
    uVar7 = sqlite3Utf8Read(&zPattern_local);
  }
  bVar10 = false;
  uVar8 = 0;
  if (uVar7 != 0x5d) goto LAB_0013b948;
  bVar10 = uVar6 == 0x5d;
LAB_0013b93a:
  uVar8 = 0;
LAB_0013b93c:
  uVar7 = sqlite3Utf8Read(&zPattern_local);
LAB_0013b948:
  if (uVar7 == 0x2d) {
    if ((*zPattern_local != ']') && (uVar8 != 0 && *zPattern_local != '\0')) goto code_r0x0013b98e;
  }
  else {
    if (uVar7 == 0x5d) {
      uVar11 = local_3c;
      if (bVar10 == bVar13) {
        return 0;
      }
      goto LAB_0013b841;
    }
    if (uVar7 == 0) {
      return 0;
    }
  }
  uVar8 = uVar7;
  if (uVar6 == uVar7) {
    bVar10 = true;
  }
  goto LAB_0013b93c;
code_r0x0013b98e:
  uVar7 = sqlite3Utf8Read(&zPattern_local);
  bVar5 = true;
  if (uVar7 < uVar6) {
    bVar5 = bVar10;
  }
  if (uVar8 <= uVar6) {
    bVar10 = bVar5;
  }
  goto LAB_0013b93a;
}

Assistant:

static int patternCompare(
  const u8 *zPattern,              /* The glob pattern */
  const u8 *zString,               /* The string to compare against the glob */
  const struct compareInfo *pInfo, /* Information about how to do the compare */
  u32 esc                          /* The escape character */
){
  u32 c, c2;
  int invert;
  int seen;
  u8 matchOne = pInfo->matchOne;
  u8 matchAll = pInfo->matchAll;
  u8 matchSet = pInfo->matchSet;
  u8 noCase = pInfo->noCase; 
  int prevEscape = 0;     /* True if the previous character was 'escape' */

  while( (c = sqlite3Utf8Read(&zPattern))!=0 ){
    if( c==matchAll && !prevEscape ){
      while( (c=sqlite3Utf8Read(&zPattern)) == matchAll
               || c == matchOne ){
        if( c==matchOne && sqlite3Utf8Read(&zString)==0 ){
          return 0;
        }
      }
      if( c==0 ){
        return 1;
      }else if( c==esc ){
        c = sqlite3Utf8Read(&zPattern);
        if( c==0 ){
          return 0;
        }
      }else if( c==matchSet ){
        assert( esc==0 );         /* This is GLOB, not LIKE */
        assert( matchSet<0x80 );  /* '[' is a single-byte character */
        while( *zString && patternCompare(&zPattern[-1],zString,pInfo,esc)==0 ){
          SQLITE_SKIP_UTF8(zString);
        }
        return *zString!=0;
      }
      while( (c2 = sqlite3Utf8Read(&zString))!=0 ){
        if( noCase ){
          GlogUpperToLower(c2);
          GlogUpperToLower(c);
          while( c2 != 0 && c2 != c ){
            c2 = sqlite3Utf8Read(&zString);
            GlogUpperToLower(c2);
          }
        }else{
          while( c2 != 0 && c2 != c ){
            c2 = sqlite3Utf8Read(&zString);
          }
        }
        if( c2==0 ) return 0;
        if( patternCompare(zPattern,zString,pInfo,esc) ) return 1;
      }
      return 0;
    }else if( c==matchOne && !prevEscape ){
      if( sqlite3Utf8Read(&zString)==0 ){
        return 0;
      }
    }else if( c==matchSet ){
      u32 prior_c = 0;
      assert( esc==0 );    /* This only occurs for GLOB, not LIKE */
      seen = 0;
      invert = 0;
      c = sqlite3Utf8Read(&zString);
      if( c==0 ) return 0;
      c2 = sqlite3Utf8Read(&zPattern);
      if( c2=='^' ){
        invert = 1;
        c2 = sqlite3Utf8Read(&zPattern);
      }
      if( c2==']' ){
        if( c==']' ) seen = 1;
        c2 = sqlite3Utf8Read(&zPattern);
      }
      while( c2 && c2!=']' ){
        if( c2=='-' && zPattern[0]!=']' && zPattern[0]!=0 && prior_c>0 ){
          c2 = sqlite3Utf8Read(&zPattern);
          if( c>=prior_c && c<=c2 ) seen = 1;
          prior_c = 0;
        }else{
          if( c==c2 ){
            seen = 1;
          }
          prior_c = c2;
        }
        c2 = sqlite3Utf8Read(&zPattern);
      }
      if( c2==0 || (seen ^ invert)==0 ){
        return 0;
      }
    }else if( esc==c && !prevEscape ){
      prevEscape = 1;
    }else{
      c2 = sqlite3Utf8Read(&zString);
      if( noCase ){
        GlogUpperToLower(c);
        GlogUpperToLower(c2);
      }
      if( c!=c2 ){
        return 0;
      }
      prevEscape = 0;
    }
  }
  return *zString==0;
}